

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::GetFrameworkVersion_abi_cxx11_(string *__return_storage_ptr__,cmTarget *this)

{
  char *pcVar1;
  allocator local_39;
  string local_38;
  
  if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                  ,0x11fb,"std::string cmTarget::GetFrameworkVersion() const");
  }
  std::__cxx11::string::string((string *)&local_38,"FRAMEWORK_VERSION",&local_39);
  pcVar1 = GetProperty(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"VERSION",&local_39);
    pcVar1 = GetProperty(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = "A";
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetFrameworkVersion() const
{
  assert(this->GetType() != INTERFACE_LIBRARY);

  if(const char* fversion = this->GetProperty("FRAMEWORK_VERSION"))
    {
    return fversion;
    }
  else if(const char* tversion = this->GetProperty("VERSION"))
    {
    return tversion;
    }
  else
    {
    return "A";
    }
}